

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O1

Vec_Ptr_t * Aig_ManCofactorBdds(Aig_Man_t *p,Vec_Ptr_t *vSubset,DdManager *dd,DdNode *bFunc)

{
  uint uVar1;
  uint uVar2;
  DdNode **pbVars;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  int iVar5;
  int Code;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  iVar5 = vSubset->nSize;
  if (iVar5 != 0x1f) {
    pbVars = (DdNode **)vSubset->pArray;
    Code = 0;
    do {
      n = Extra_bddBitsToCube(dd,Code,iVar5,pbVars,1);
      Cudd_Ref(n);
      n_00 = Cudd_Cofactor(dd,bFunc,n);
      Cudd_Ref(n_00);
      n_01 = Cudd_bddAnd(dd,n_00,n);
      Cudd_Ref(n_01);
      Cudd_RecursiveDeref(dd,n_00);
      Cudd_RecursiveDeref(dd,n);
      uVar1 = pVVar3->nSize;
      uVar2 = pVVar3->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          iVar5 = 0x10;
        }
        else {
          iVar5 = uVar2 * 2;
          if (iVar5 <= (int)uVar2) goto LAB_00612ce1;
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = iVar5;
      }
LAB_00612ce1:
      pVVar3->nSize = uVar1 + 1;
      pVVar3->pArray[(int)uVar1] = n_01;
      Code = Code + 1;
      iVar5 = vSubset->nSize;
    } while (Code < 1 << ((byte)iVar5 & 0x1f));
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Aig_ManCofactorBdds( Aig_Man_t * p, Vec_Ptr_t * vSubset, DdManager * dd, DdNode * bFunc )
{
    Vec_Ptr_t * vCofs;
    DdNode * bCube, * bTemp, * bCof, ** pbVars;
    int i;
    vCofs = Vec_PtrAlloc( 100 );
    pbVars = (DdNode **)Vec_PtrArray(vSubset);
    for ( i = 0; i < (1 << Vec_PtrSize(vSubset)); i++ )
    {
        bCube = Extra_bddBitsToCube( dd, i, Vec_PtrSize(vSubset), pbVars, 1 );  Cudd_Ref( bCube );
        bCof  = Cudd_Cofactor( dd, bFunc, bCube );        Cudd_Ref( bCof );
        bCof  = Cudd_bddAnd( dd, bTemp = bCof, bCube );   Cudd_Ref( bCof );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
        Vec_PtrPush( vCofs, bCof );
    }
    return vCofs;
}